

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

void __thiscall
dtc::text_input_buffer::parse_error(text_input_buffer *this,char *msg,input_buffer *b,int loc)

{
  FILE *__stream;
  undefined4 extraout_var;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  
  __stream = _stderr;
  if ((loc < 0) || (b->size < loc)) {
    return;
  }
  uVar3 = 1;
  uVar7 = 0;
  for (uVar4 = (ulong)(uint)loc; 0 < (long)uVar4; uVar4 = uVar4 - 1) {
    uVar2 = (int)uVar4 + 1;
    if (uVar7 != 0) {
      uVar2 = uVar7;
    }
    bVar9 = b->buffer[uVar4] == '\n';
    if (bVar9) {
      uVar7 = uVar2;
    }
    uVar3 = uVar3 + bVar9;
  }
  pcVar1 = b->buffer + (uint)loc;
  iVar5 = loc;
  do {
    pcVar1 = pcVar1 + 1;
    iVar5 = iVar5 + 1;
    iVar6 = loc;
    if (b->size <= iVar5) break;
    iVar6 = iVar5;
  } while (*pcVar1 != '\n');
  iVar5 = (**b->_vptr_input_buffer)(b);
  uVar2 = loc - uVar7;
  fprintf(__stream,"Error at %s:%d:%d: %s\n",*(undefined8 *)CONCAT44(extraout_var,iVar5),
          (ulong)uVar3,(ulong)uVar2,msg);
  fwrite(b->buffer + uVar7,(long)(int)(iVar6 - uVar7),1,_stderr);
  putc(10,_stderr);
  lVar8 = (long)(int)uVar7;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar4 = (ulong)uVar2;
  while (bVar9 = uVar4 != 0, uVar4 = uVar4 - 1, bVar9) {
    iVar5 = 0x20;
    if (b->buffer[lVar8] == '\t') {
      iVar5 = 9;
    }
    putc(iVar5,_stderr);
    lVar8 = lVar8 + 1;
  }
  putc(0x5e,_stderr);
  putc(10,_stderr);
  return;
}

Assistant:

void
text_input_buffer::parse_error(const char *msg,
                               input_buffer &b,
                               int loc)
{
	int line_count = 1;
	int line_start = 0;
	int line_end = loc;
	if (loc < 0 || loc > b.size)
	{
		return;
	}
	for (int i=loc ; i>0 ; --i)
	{
		if (b.buffer[i] == '\n')
		{
			line_count++;
			if (line_start == 0)
			{
				line_start = i+1;
			}
		}
	}
	for (int i=loc+1 ; i<b.size ; ++i)
	{
		if (b.buffer[i] == '\n')
		{
			line_end = i;
			break;
		}
	}
	fprintf(stderr, "Error at %s:%d:%d: %s\n", b.filename().c_str(), line_count, loc - line_start, msg);
	fwrite(&b.buffer[line_start], line_end-line_start, 1, stderr);
	putc('\n', stderr);
	for (int i=0 ; i<(loc-line_start) ; ++i)
	{
		char c = (b.buffer[i+line_start] == '\t') ? '\t' : ' ';
		putc(c, stderr);
	}
	putc('^', stderr);
	putc('\n', stderr);
}